

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi)

{
  int iVar1;
  RefCntBuffer *pRVar2;
  MV_REFERENCE_FRAME ref;
  long lVar3;
  int iVar4;
  InterpFilter ifilter;
  long lVar5;
  int iVar6;
  int local_48 [8];
  int ref_total [8];
  
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if ((cpi->last_frame_type != '\0') && ((cpi->refresh_frame).alt_ref_frame == false)) {
    lVar3 = 1;
    do {
      iVar4 = local_48[lVar3];
      iVar1 = (cpi->common).remapped_ref_idx[(int)lVar3 - 1];
      lVar5 = 0;
      do {
        iVar6 = 0;
        if ((iVar1 != -1) &&
           (pRVar2 = (cpi->common).ref_frame_map[iVar1], iVar6 = 0, pRVar2 != (RefCntBuffer *)0x0))
        {
          iVar6 = pRVar2->interp_filter_selected[lVar5];
        }
        iVar4 = iVar4 + iVar6;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      local_48[lVar3] = iVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    lVar3 = 0;
    do {
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0xc);
  }
  return 0x1ff;
}

Assistant:

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  int ref_total[REF_FRAMES] = { 0 };
  uint16_t mask = ALLOW_ALL_INTERP_FILT_MASK;

  if (cpi->last_frame_type == KEY_FRAME || cpi->refresh_frame.alt_ref_frame)
    return mask;

  for (MV_REFERENCE_FRAME ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
    for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
         ++ifilter) {
      ref_total[ref] += get_interp_filter_selected(cm, ref, ifilter);
    }
  }
  int ref_total_total = (ref_total[LAST2_FRAME] + ref_total[LAST3_FRAME] +
                         ref_total[GOLDEN_FRAME] + ref_total[BWDREF_FRAME] +
                         ref_total[ALTREF2_FRAME] + ref_total[ALTREF_FRAME]);

  for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
       ++ifilter) {
    int last_score = get_interp_filter_selected(cm, LAST_FRAME, ifilter) * 30;
    if (ref_total[LAST_FRAME] && last_score <= ref_total[LAST_FRAME]) {
      int filter_score =
          get_interp_filter_selected(cm, LAST2_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, LAST3_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, GOLDEN_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, BWDREF_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF2_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF_FRAME, ifilter) * 10;
      if (filter_score < ref_total_total) {
        DUAL_FILTER_TYPE filt_type = ifilter + SWITCHABLE_FILTERS * ifilter;
        reset_interp_filter_allowed_mask(&mask, filt_type);
      }
    }
  }
  return mask;
}